

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
::visit_begin_object
          (json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
           *this,semantic_tag tag,ser_context *param_2,error_code *param_3)

{
  semantic_tag local_29;
  size_t local_28;
  structure_type local_1c;
  
  local_29 = tag;
  if ((this->structure_stack_).
      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].type_ == root_t) {
    this->index_ = 0;
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::_M_erase_at_end(&this->item_stack_,
                      (this->item_stack_).
                      super__Vector_base<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    this->is_valid_ = false;
  }
  local_28 = this->index_;
  this->index_ = local_28 + 1;
  std::
  vector<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>>
  ::
  emplace_back<std::__cxx11::wstring,unsigned_long,jsoncons::json_object_arg_t_const&,jsoncons::semantic_tag&>
            ((vector<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>>>
              *)&this->item_stack_,&this->name_,&local_28,(json_object_arg_t *)&json_object_arg,
             &local_29);
  local_1c = object_t;
  local_28 = ((long)(this->item_stack_).
                    super__Vector_base<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->item_stack_).
                    super__Vector_base<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 - 1;
  std::
  vector<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>::structure_info,std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>::structure_info>>
  ::
  emplace_back<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>::structure_type,unsigned_long>
            ((vector<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>::structure_info,std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>::structure_info>>
              *)&this->structure_stack_,&local_1c,&local_28);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(semantic_tag tag, const ser_context&, std::error_code&) override
    {
        if (structure_stack_.back().type_ == structure_type::root_t)
        {
            index_ = 0;
            item_stack_.clear();
            is_valid_ = false;
        }
        item_stack_.emplace_back(std::move(name_), index_++, json_object_arg, tag);
        structure_stack_.emplace_back(structure_type::object_t, item_stack_.size()-1);
        JSONCONS_VISITOR_RETURN;
    }